

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

RGB __thiscall
pbrt::GBufferFilm::ToOutputRGB(GBufferFilm *this,SampledSpectrum *L,SampledWavelengths *lambda)

{
  undefined1 auVar1 [16];
  undefined8 extraout_XMM0_Qb;
  RGB RVar2;
  RGB local_18;
  
  RVar2 = PixelSensor::ToSensorRGB((this->super_FilmBase).sensor,L,lambda);
  local_18.b = RVar2.b;
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_8_ = RVar2._0_8_;
  local_18._0_8_ = vmovlps_avx(auVar1);
  RVar2 = Mul<pbrt::RGB,3,pbrt::RGB>(&this->outputRGBFromSensorRGB,&local_18);
  return RVar2;
}

Assistant:

PBRT_CPU_GPU
    RGB ToOutputRGB(const SampledSpectrum &L, const SampledWavelengths &lambda) const {
        RGB cameraRGB = sensor->ToSensorRGB(L, lambda);
        return outputRGBFromSensorRGB * cameraRGB;
    }